

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::MutableMessage
          (ExtensionSet *this,int number,FieldType type,MessageLite *prototype,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  undefined8 uVar2;
  long *in_RCX;
  undefined1 in_DL;
  Extension **in_RDI;
  Extension *extension;
  FieldDescriptor *in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff0c;
  ExtensionSet *in_stack_ffffffffffffff10;
  undefined8 *local_30;
  MessageLite *local_8;
  
  bVar1 = MaybeNewExtension(in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c,
                            in_stack_ffffffffffffff00,in_RDI);
  if (bVar1) {
    *(undefined1 *)(local_30 + 1) = in_DL;
    *(undefined1 *)((long)local_30 + 9) = 0;
    *(byte *)((long)local_30 + 10) = *(byte *)((long)local_30 + 10) & 0xf;
    uVar2 = (**(code **)(*in_RCX + 0x20))(in_RCX,*in_RDI);
    *local_30 = uVar2;
    *(byte *)((long)local_30 + 10) = *(byte *)((long)local_30 + 10) & 0xf0;
    local_8 = (MessageLite *)*local_30;
  }
  else {
    *(byte *)((long)local_30 + 10) = *(byte *)((long)local_30 + 10) & 0xf0;
    if ((*(byte *)((long)local_30 + 10) >> 4 & 1) == 0) {
      local_8 = (MessageLite *)*local_30;
    }
    else {
      local_8 = (MessageLite *)(**(code **)(*(long *)*local_30 + 0x20))((long *)*local_30,in_RCX);
    }
  }
  return local_8;
}

Assistant:

MessageLite* ExtensionSet::MutableMessage(int number, FieldType type,
                                          const MessageLite& prototype,
                                          const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_MESSAGE);
    extension->is_repeated = false;
    extension->is_lazy = false;
    extension->message_value = prototype.New(arena_);
    extension->is_cleared = false;
    return extension->message_value;
  } else {
    GOOGLE_DCHECK_TYPE(*extension, OPTIONAL_FIELD, MESSAGE);
    extension->is_cleared = false;
    if (extension->is_lazy) {
      return extension->lazymessage_value->MutableMessage(prototype);
    } else {
      return extension->message_value;
    }
  }
}